

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int getnumlimit(Header *h,char **fmt,int df)

{
  uint uVar1;
  int sz;
  int df_local;
  char **fmt_local;
  Header *h_local;
  
  uVar1 = getnum(fmt,df);
  if ((0x10 < (int)uVar1) || ((int)uVar1 < 1)) {
    luaL_error(h->L,"integral size (%d) out of limits [1,%d]",(ulong)uVar1,0x10);
  }
  return uVar1;
}

Assistant:

static int getnumlimit(Header *h, const char **fmt, int df) {
    int sz = getnum(fmt, df);
    if (sz > MAXINTSIZE || sz <= 0)
        luaL_error(h->L, "integral size (%d) out of limits [1,%d]",
                   sz, MAXINTSIZE);
    return sz;
}